

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_CCtx_params cctxParams;
  
  memset(&cctxParams,0,0xb0);
  cctxParams.cParams._0_8_ = params.cParams._0_8_;
  cctxParams.cParams.hashLog = params.cParams.hashLog;
  cctxParams.cParams._20_8_ = params.cParams._20_8_;
  cctxParams.cParams.searchLog = params.cParams.searchLog;
  cctxParams.cParams.minMatch = params.cParams.minMatch;
  cctxParams.fParams.contentSizeFlag = params.fParams.contentSizeFlag;
  cctxParams.fParams.checksumFlag = params.fParams.checksumFlag;
  cctxParams.fParams.noDictIDFlag = params.fParams.noDictIDFlag;
  cctxParams.compressionLevel = 0;
  if (cctxParams.useRowMatchFinder == ZSTD_urm_auto) {
    cctxParams.useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
    if (0xfffffffc < params.cParams.strategy - ZSTD_btlazy2) {
      cctxParams.useRowMatchFinder =
           ZSTD_urm_enableRowMatchFinder - (params.cParams.windowLog < 0xf);
    }
  }
  sVar1 = ZSTD_compressBegin_advanced_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&cctxParams,
                     pledgedSrcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_CCtxParams_init_internal(&cctxParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            &cctxParams, pledgedSrcSize);
}